

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgtcp(fitsfile *infptr,fitsfile *outfptr,int cpopt,int *status)

{
  int iVar1;
  int *in_RCX;
  long in_RSI;
  long in_RDI;
  HDUtracker HDU;
  int i;
  undefined8 auStackY_5df0 [65];
  int *in_stack_ffffffffffffa418;
  HDUtracker *in_stack_ffffffffffffa420;
  int in_stack_ffffffffffffa42c;
  fitsfile *in_stack_ffffffffffffa430;
  fitsfile *in_stack_ffffffffffffa438;
  char *in_stack_ffffffffffffaa38;
  int *in_stack_ffffffffffffaa40;
  HDUtracker *in_stack_ffffffffffffaa48;
  fitsfile *in_stack_ffffffffffffaa50;
  undefined8 auStack_2f10 [1500];
  int local_2c;
  int *local_28;
  int local_4;
  
  if (*in_RCX == 0) {
    local_28 = in_RCX;
    if (in_RDI == in_RSI) {
      *in_RCX = 0x15c;
    }
    else {
      iVar1 = fftsad(in_stack_ffffffffffffaa50,in_stack_ffffffffffffaa48,in_stack_ffffffffffffaa40,
                     in_stack_ffffffffffffaa38);
      *local_28 = iVar1;
      iVar1 = ffgtcpr(in_stack_ffffffffffffa438,in_stack_ffffffffffffa430,in_stack_ffffffffffffa42c,
                      in_stack_ffffffffffffa420,in_stack_ffffffffffffa418);
      *local_28 = iVar1;
      for (local_2c = 0; local_2c < 0; local_2c = local_2c + 1) {
        free((void *)auStackY_5df0[local_2c]);
        free((void *)auStack_2f10[local_2c]);
      }
    }
    local_4 = *local_28;
  }
  else {
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int ffgtcp(fitsfile *infptr,  /* input FITS file pointer                     */
	   fitsfile *outfptr, /* output FITS file pointer                    */
	   int        cpopt,  /* code specifying copy options:
				OPT_GCP_GPT (0) ==> copy only grouping table
				OPT_GCP_ALL (2) ==> recusrively copy members 
				                    and their members (if 
						    groups)                  */
	   int      *status)  /* return status code                          */

/*
  copy a grouping table, and optionally all its members, to a new FITS file.
  If the cpopt is set to OPT_GCP_GPT (copy grouping table only) then the 
  existing members have their GRPIDn and GRPLCn keywords updated to reflect 
  the existance of the new group, since they now belong to another group. If 
  cpopt is set to OPT_GCP_ALL (copy grouping table and members recursively) 
  then the original members are not updated; the new grouping table is 
  modified to include only the copied member HDUs and not the original members.

  Note that the recursive version of this function, ffgtcpr(), is called
  to perform the group table copy. In the case of cpopt == OPT_GCP_GPT
  ffgtcpr() does not actually use recursion.
*/

{
  int i;

  HDUtracker HDU;


  if(*status != 0) return(*status);

  /* make sure infptr and outfptr are not the same pointer */

  if(infptr == outfptr) *status = IDENTICAL_POINTERS;
  else
    {

      /* initialize the HDUtracker struct */
      
      HDU.nHDU = 0;
      
      *status = fftsad(infptr,&HDU,NULL,NULL);
      
      /* 
	 call the recursive form of this function to copy the grouping table. 
	 If the cpopt is OPT_GCP_GPT then there is actually no recursion
	 performed
      */

      *status = ffgtcpr(infptr,outfptr,cpopt,&HDU,status);
  
      /* free memory allocated for the HDUtracker struct */

      for(i = 0; i < HDU.nHDU; ++i) 
	{
	  free(HDU.filename[i]);
	  free(HDU.newFilename[i]);
	}
    }

  return(*status);
}